

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall basisu::vector<basisu::color_rgba>::clear(vector<basisu::color_rgba> *this)

{
  color_rgba *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if (*(long *)in_RDI != 0) {
    scalar_type<basisu::color_rgba>::destruct_array(in_RDI,in_stack_ffffffffffffffe8);
    free(*(void **)in_RDI);
    *(undefined8 *)in_RDI = 0;
    in_RDI[2].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
    in_RDI[3].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }